

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86assembler.cpp
# Opt level: O3

Error __thiscall asmjit::X86Assembler::align(X86Assembler *this,uint32_t mode,uint32_t alignment)

{
  byte bVar1;
  Error EVar2;
  long lVar3;
  uint8_t *puVar4;
  uint uVar5;
  uint uVar6;
  uint8_t *__s;
  uint uVar7;
  ulong uVar8;
  float in_XMM0_Da;
  
  if (((this->super_Assembler).super_CodeEmitter._globalOptions & 4) != 0) {
    Logger::logf(((this->super_Assembler).super_CodeEmitter._code)->_logger,in_XMM0_Da);
  }
  if (mode < 3) {
    if (alignment < 2) {
      return 0;
    }
    if (alignment < 0x41 && (alignment - 1 & alignment) == 0) {
      __s = (this->super_Assembler)._bufferPtr;
      lVar3 = (long)__s - (long)(this->super_Assembler)._bufferData;
      uVar8 = (-(ulong)alignment & (ulong)(alignment - 1) + lVar3) - lVar3;
      if ((int)uVar8 == 0) {
        return 0;
      }
      if ((ulong)((long)(this->super_Assembler)._bufferEnd - (long)__s) < (uVar8 & 0xffffffff)) {
        EVar2 = CodeHolder::growBuffer
                          ((this->super_Assembler).super_CodeEmitter._code,
                           &((this->super_Assembler)._section)->_buffer,uVar8 & 0xffffffff);
        if (EVar2 != 0) goto LAB_00165a77;
        __s = (this->super_Assembler)._bufferPtr;
      }
      if (mode == 1) {
        bVar1 = 0xcc;
      }
      else if (mode == 0) {
        bVar1 = 0x90;
        if (((this->super_Assembler).super_CodeEmitter._globalHints & 1) != 0) {
          do {
            puVar4 = __s;
            uVar7 = (uint)uVar8;
            uVar5 = 9;
            if (uVar7 < 9) {
              uVar5 = uVar7;
            }
            uVar6 = uVar7;
            if (8 < (uVar8 & 0xffffffff)) {
              uVar6 = 9;
            }
            lVar3 = 0;
            do {
              puVar4[lVar3] = align::nopData[uVar5 - 1][lVar3];
              lVar3 = lVar3 + 1;
            } while (uVar6 != (uint)lVar3);
            uVar8 = (ulong)(uVar7 - uVar5);
            __s = puVar4 + lVar3;
          } while (uVar7 - uVar5 != 0);
          puVar4 = puVar4 + lVar3;
          goto LAB_00165b84;
        }
      }
      else {
        bVar1 = 0;
      }
      memset(__s,(uint)bVar1,uVar8 & 0xffffffff);
      puVar4 = __s + (uVar8 & 0xffffffff);
LAB_00165b84:
      (this->super_Assembler)._bufferPtr = puVar4;
      return 0;
    }
  }
  EVar2 = 3;
LAB_00165a77:
  EVar2 = CodeEmitter::setLastError((CodeEmitter *)this,EVar2,(char *)0x0);
  return EVar2;
}

Assistant:

Error X86Assembler::align(uint32_t mode, uint32_t alignment) {
#if !defined(ASMJIT_DISABLE_LOGGING)
  if (_globalOptions & kOptionLoggingEnabled)
    _code->_logger->logf("%s.align %u\n", _code->_logger->getIndentation(), alignment);
#endif // !ASMJIT_DISABLE_LOGGING

  if (mode >= kAlignCount)
    return setLastError(DebugUtils::errored(kErrorInvalidArgument));

  if (alignment <= 1)
    return kErrorOk;

  if (!Utils::isPowerOf2(alignment) || alignment > Globals::kMaxAlignment)
    return setLastError(DebugUtils::errored(kErrorInvalidArgument));

  uint32_t i = static_cast<uint32_t>(Utils::alignDiff<size_t>(getOffset(), alignment));
  if (i == 0)
    return kErrorOk;

  if (getRemainingSpace() < i) {
    Error err = _code->growBuffer(&_section->_buffer, i);
    if (ASMJIT_UNLIKELY(err)) return setLastError(err);
  }

  uint8_t* cursor = _bufferPtr;
  uint8_t pattern = 0x00;

  switch (mode) {
    case kAlignCode: {
      if (_globalHints & kHintOptimizedAlign) {
        // Intel 64 and IA-32 Architectures Software Developer's Manual - Volume 2B (NOP).
        enum { kMaxNopSize = 9 };

        static const uint8_t nopData[kMaxNopSize][kMaxNopSize] = {
          { 0x90 },
          { 0x66, 0x90 },
          { 0x0F, 0x1F, 0x00 },
          { 0x0F, 0x1F, 0x40, 0x00 },
          { 0x0F, 0x1F, 0x44, 0x00, 0x00 },
          { 0x66, 0x0F, 0x1F, 0x44, 0x00, 0x00 },
          { 0x0F, 0x1F, 0x80, 0x00, 0x00, 0x00, 0x00 },
          { 0x0F, 0x1F, 0x84, 0x00, 0x00, 0x00, 0x00, 0x00 },
          { 0x66, 0x0F, 0x1F, 0x84, 0x00, 0x00, 0x00, 0x00, 0x00 }
        };

        do {
          uint32_t n = std::min<uint32_t>(i, kMaxNopSize);
          const uint8_t* src = nopData[n - 1];

          i -= n;
          do {
            EMIT_BYTE(*src++);
          } while (--n);
        } while (i);
      }

      pattern = 0x90;
      break;
    }

    case kAlignData:
      pattern = 0xCC;
      break;

    case kAlignZero:
      // Pattern already set to zero.
      break;
  }

  while (i) {
    EMIT_BYTE(pattern);
    i--;
  }

  _bufferPtr = cursor;
  return kErrorOk;
}